

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O1

bool __thiscall
solitaire::events::EventsProcessor::checkIfCollidesAndTryClickButtons
          (EventsProcessor *this,MouseLeftButtonDown *event)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _func_int **pp_Var3;
  long lVar4;
  
  iVar2 = (*this->context->_vptr_Context[0xc])();
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
                    ((long *)CONCAT44(extraout_var,iVar2),event);
  pp_Var3 = this->context->_vptr_Context;
  lVar4 = 0x10;
  if (cVar1 == '\0') {
    iVar2 = (*pp_Var3[0xe])();
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))
                      ((long *)CONCAT44(extraout_var_00,iVar2),event);
    if (cVar1 == '\0') {
      return false;
    }
    pp_Var3 = this->context->_vptr_Context;
    lVar4 = 0x18;
  }
  iVar2 = (*pp_Var3[4])();
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + lVar4))
            ((long *)CONCAT44(extraout_var_01,iVar2));
  return true;
}

Assistant:

bool EventsProcessor::checkIfCollidesAndTryClickButtons(
    const MouseLeftButtonDown& event) const
{
    if (context.getNewGameButton().collidesWith(event.position)) {
        context.getSolitaire().startNewGame();
        return true;
    }
    if (context.getUndoButton().collidesWith(event.position)) {
        context.getSolitaire().tryUndoOperation();
        return true;
    }
    return false;
}